

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.cpp
# Opt level: O2

void read_pred_weight_table(h264_stream_t *h,bs_t *b)

{
  int iVar1;
  sps_t *psVar2;
  slice_header_t *psVar3;
  uint32_t uVar4;
  int32_t iVar5;
  int iVar6;
  long lVar7;
  int (*paiVar8) [2];
  long lVar9;
  
  psVar2 = h->sps;
  psVar3 = h->sh;
  uVar4 = bs_read_ue(b);
  (psVar3->pwt).luma_log2_weight_denom = uVar4;
  if (psVar2->ChromaArrayType != 0) {
    uVar4 = bs_read_ue(b);
    (psVar3->pwt).chroma_log2_weight_denom = uVar4;
  }
  paiVar8 = (psVar3->pwt).chroma_offset_l0;
  for (lVar9 = 0; lVar9 <= psVar3->num_ref_idx_l0_active_minus1; lVar9 = lVar9 + 1) {
    uVar4 = bs_read_u1(b);
    (psVar3->pwt).luma_weight_l0_flag[lVar9] = uVar4;
    if (uVar4 != 0) {
      iVar5 = bs_read_se(b);
      (psVar3->pwt).luma_weight_l0[lVar9] = iVar5;
      iVar5 = bs_read_se(b);
      (psVar3->pwt).luma_offset_l0[lVar9] = iVar5;
    }
    if (psVar2->ChromaArrayType != 0) {
      uVar4 = bs_read_u1(b);
      (psVar3->pwt).chroma_weight_l0_flag[lVar9] = uVar4;
      if (uVar4 != 0) {
        for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
          iVar5 = bs_read_se(b);
          paiVar8[-0x40][lVar7] = iVar5;
          iVar5 = bs_read_se(b);
          (*paiVar8)[lVar7] = iVar5;
        }
      }
    }
    paiVar8 = paiVar8 + 1;
  }
  iVar1 = psVar3->slice_type;
  iVar6 = iVar1 + -5;
  if (iVar1 < 5) {
    iVar6 = iVar1;
  }
  if (iVar6 == 1) {
    paiVar8 = (psVar3->pwt).chroma_offset_l1;
    for (lVar9 = 0; lVar9 <= psVar3->num_ref_idx_l1_active_minus1; lVar9 = lVar9 + 1) {
      uVar4 = bs_read_u1(b);
      (psVar3->pwt).luma_weight_l1_flag[lVar9] = uVar4;
      if (uVar4 != 0) {
        iVar5 = bs_read_se(b);
        (psVar3->pwt).luma_weight_l1[lVar9] = iVar5;
        iVar5 = bs_read_se(b);
        (psVar3->pwt).luma_offset_l1[lVar9] = iVar5;
      }
      if (psVar2->ChromaArrayType != 0) {
        uVar4 = bs_read_u1(b);
        (psVar3->pwt).chroma_weight_l1_flag[lVar9] = uVar4;
        if (uVar4 != 0) {
          for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
            iVar5 = bs_read_se(b);
            paiVar8[-0x40][lVar7] = iVar5;
            iVar5 = bs_read_se(b);
            (*paiVar8)[lVar7] = iVar5;
          }
        }
      }
      paiVar8 = paiVar8 + 1;
    }
  }
  return;
}

Assistant:

void read_pred_weight_table(h264_stream_t* h, bs_t* b)
{
    slice_header_t* sh = h->sh;
    sps_t* sps = h->sps;
    pps_t* pps = h->pps;

    int i, j;

    sh->pwt.luma_log2_weight_denom = bs_read_ue(b);
    if( sps->ChromaArrayType != 0 )
    {
        sh->pwt.chroma_log2_weight_denom = bs_read_ue(b);
    }
    for( i = 0; i <= sh->num_ref_idx_l0_active_minus1; i++ )
    {
        sh->pwt.luma_weight_l0_flag[i] = bs_read_u1(b);
        if( sh->pwt.luma_weight_l0_flag[i] )
        {
            sh->pwt.luma_weight_l0[ i ] = bs_read_se(b);
            sh->pwt.luma_offset_l0[ i ] = bs_read_se(b);
        }
        if ( sps->ChromaArrayType != 0 )
        {
            sh->pwt.chroma_weight_l0_flag[i] = bs_read_u1(b);
            if( sh->pwt.chroma_weight_l0_flag[i] )
            {
                for( j =0; j < 2; j++ )
                {
                    sh->pwt.chroma_weight_l0[ i ][ j ] = bs_read_se(b);
                    sh->pwt.chroma_offset_l0[ i ][ j ] = bs_read_se(b);
                }
            }
        }
    }
    if( is_slice_type( sh->slice_type, SH_SLICE_TYPE_B ) )
    {
        for( i = 0; i <= sh->num_ref_idx_l1_active_minus1; i++ )
        {
            sh->pwt.luma_weight_l1_flag[i] = bs_read_u1(b);
            if( sh->pwt.luma_weight_l1_flag[i] )
            {
                sh->pwt.luma_weight_l1[ i ] = bs_read_se(b);
                sh->pwt.luma_offset_l1[ i ] = bs_read_se(b);
            }
            if( sps->ChromaArrayType != 0 )
            {
                sh->pwt.chroma_weight_l1_flag[i] = bs_read_u1(b);
                if( sh->pwt.chroma_weight_l1_flag[i] )
                {
                    for( j = 0; j < 2; j++ )
                    {
                        sh->pwt.chroma_weight_l1[ i ][ j ] = bs_read_se(b);
                        sh->pwt.chroma_offset_l1[ i ][ j ] = bs_read_se(b);
                    }
                }
            }
        }
    }
}